

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constexpr_parser.h
# Opt level: O1

char * absl::lts_20250127::str_format_internal::ConsumeConversion<false>
                 (char *pos,char *end,UnboundConversion *conv,int *next_arg)

{
  Flags FVar1;
  FormatConversionChar FVar2;
  int *piVar3;
  Flags FVar4;
  bool bVar5;
  int iVar6;
  char *pcVar7;
  int iVar8;
  byte *pbVar9;
  byte *pbVar10;
  byte bVar11;
  byte *pbVar12;
  char cVar13;
  ConvTag tag;
  ConvTag tag_1;
  ConvTag local_41;
  int *local_40;
  char *local_38;
  
  if (pos != end) {
    local_40 = next_arg;
    if (conv->flags != kBasic) {
      __assert_fail("conv->flags == Flags::kBasic",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/internal/str_format/constexpr_parser.h"
                    ,0xee,
                    "const char *absl::str_format_internal::ConsumeConversion(const char *, const char *const, UnboundConversion *, int *) [is_positional = false]"
                   );
    }
    bVar11 = *pos;
    pbVar12 = (byte *)(pos + 1);
    pcVar7 = pos;
    if ((char)bVar11 < 'A') {
      do {
        local_38 = pcVar7;
        if ('0' < (char)bVar11) goto LAB_0038a65f;
        local_41.tag_ = ConvTagHolder::value[bVar11].tag_;
        cVar13 = '\x05';
        if ((local_41.tag_ & 0xe0) == 0xc0) {
          FVar1 = conv->flags;
          FVar4 = ConvTag::as_flags(&local_41);
          conv->flags = FVar4 | FVar1;
          cVar13 = pbVar12 == (byte *)end;
          if (!(bool)cVar13) {
            bVar11 = *pbVar12;
            pbVar12 = pbVar12 + 1;
          }
        }
        pcVar7 = local_38;
      } while (cVar13 == '\0');
      if (cVar13 != '\x05') {
        return (char *)0x0;
      }
LAB_0038a65f:
      if ((char)bVar11 < ':') {
        if ((char)bVar11 < '0') {
          if (bVar11 == 0x2a) {
            conv->flags = conv->flags | kNonBasic;
            if (pbVar12 == (byte *)end) {
              return (char *)0x0;
            }
            bVar11 = *pbVar12;
            iVar6 = *local_40;
            *local_40 = iVar6 + 1;
            if (iVar6 < 0) goto LAB_0038a9c2;
            pbVar12 = pbVar12 + 1;
            (conv->width).value_ = -2 - iVar6;
          }
        }
        else {
          iVar6 = bVar11 - 0x30;
          pbVar9 = pbVar12;
          if (pbVar12 != (byte *)end) {
            pbVar10 = pbVar12 + 9;
            iVar8 = -8;
            do {
              bVar11 = *pbVar12;
              if ((byte)(bVar11 - 0x3a) < 0xf6) {
                pbVar9 = pbVar12 + 1;
                break;
              }
              pbVar9 = pbVar10;
              if (iVar8 == 0) break;
              pbVar12 = pbVar12 + 1;
              iVar6 = (int)(char)bVar11 + iVar6 * 10 + -0x30;
              iVar8 = iVar8 + 1;
              pbVar9 = (byte *)end;
            } while (pbVar12 != (byte *)end);
          }
          if (bVar11 == 0x24) {
            if (*local_40 == 0) {
              *local_40 = -1;
              pcVar7 = ConsumeConversion<true>(local_38,end,conv,local_40);
            }
            else {
              pcVar7 = (char *)0x0;
            }
          }
          else {
            conv->flags = conv->flags | kNonBasic;
            if (iVar6 < 0) goto LAB_0038a9a3;
            (conv->width).value_ = iVar6;
            pcVar7 = (char *)0x0;
          }
          pbVar12 = pbVar9;
          if (bVar11 == 0x24) {
            return pcVar7;
          }
        }
      }
      if (bVar11 == 0x2e) {
        conv->flags = conv->flags | kNonBasic;
        if (pbVar12 == (byte *)end) {
          return (char *)0x0;
        }
        pbVar9 = pbVar12 + 1;
        bVar11 = *pbVar12;
        if ((byte)(bVar11 - 0x30) < 10) {
          iVar6 = bVar11 - 0x30;
          pbVar10 = pbVar9;
          if (pbVar9 != (byte *)end) {
            iVar8 = -8;
            do {
              bVar11 = *pbVar9;
              if ((byte)(bVar11 - 0x3a) < 0xf6) {
                pbVar10 = pbVar9 + 1;
                break;
              }
              pbVar10 = pbVar12 + 10;
              if (iVar8 == 0) break;
              pbVar9 = pbVar9 + 1;
              iVar6 = (int)(char)bVar11 + iVar6 * 10 + -0x30;
              iVar8 = iVar8 + 1;
              pbVar10 = (byte *)end;
            } while (pbVar9 != (byte *)end);
          }
          if (iVar6 < 0) {
LAB_0038a9a3:
            __assert_fail("value >= 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/internal/str_format/constexpr_parser.h"
                          ,0x2e,
                          "void absl::str_format_internal::UnboundConversion::InputValue::set_value(int)"
                         );
          }
          (conv->precision).value_ = iVar6;
          pbVar12 = pbVar10;
        }
        else if (bVar11 == 0x2a) {
          if (pbVar9 == (byte *)end) {
            return (char *)0x0;
          }
          bVar11 = *pbVar9;
          iVar6 = *local_40;
          *local_40 = iVar6 + 1;
          if (iVar6 < 0) {
LAB_0038a9c2:
            __assert_fail("value > 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/internal/str_format/constexpr_parser.h"
                          ,0x39,
                          "void absl::str_format_internal::UnboundConversion::InputValue::set_from_arg(int)"
                         );
          }
          pbVar12 = pbVar12 + 2;
          (conv->precision).value_ = -2 - iVar6;
        }
        else {
          (conv->precision).value_ = 0;
          pbVar12 = pbVar9;
        }
      }
    }
    piVar3 = local_40;
    FVar2 = ConvTagHolder::value[bVar11].tag_;
    if (((bVar11 != 0x76) || (conv->flags == kBasic)) && (-1 < (char)FVar2)) {
      bVar5 = CheckFastPathSetting(conv);
      if (!bVar5) {
        __assert_fail("CheckFastPathSetting(*conv)",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/internal/str_format/constexpr_parser.h"
                      ,0x14d,
                      "const char *absl::str_format_internal::ConsumeConversion(const char *, const char *const, UnboundConversion *, int *) [is_positional = false]"
                     );
      }
      if ((char)FVar2 < '\0') {
        __assert_fail("is_conv()",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/internal/str_format/constexpr_parser.h"
                      ,99,"FormatConversionChar absl::str_format_internal::ConvTag::as_conv() const"
                     );
      }
      conv->conv = FVar2;
      iVar6 = *piVar3 + 1;
      *piVar3 = iVar6;
      conv->arg_position = iVar6;
      return (char *)pbVar12;
    }
  }
  return (char *)0x0;
}

Assistant:

constexpr const char* ConsumeConversion(const char* pos, const char* const end,
                                        UnboundConversion* conv,
                                        int* next_arg) {
  const char* const original_pos = pos;
  char c = 0;
  // Read the next char into `c` and update `pos`. Returns false if there are
  // no more chars to read.
#define ABSL_FORMAT_PARSER_INTERNAL_GET_CHAR()          \
  do {                                                  \
    if (ABSL_PREDICT_FALSE(pos == end)) return nullptr; \
    c = *pos++;                                         \
  } while (0)

  if (is_positional) {
    ABSL_FORMAT_PARSER_INTERNAL_GET_CHAR();
    if (ABSL_PREDICT_FALSE(c < '1' || c > '9')) return nullptr;
    conv->arg_position = ParseDigits(c, pos, end);
    assert(conv->arg_position > 0);
    if (ABSL_PREDICT_FALSE(c != '$')) return nullptr;
  }

  ABSL_FORMAT_PARSER_INTERNAL_GET_CHAR();

  // We should start with the basic flag on.
  assert(conv->flags == Flags::kBasic);

  // Any non alpha character makes this conversion not basic.
  // This includes flags (-+ #0), width (1-9, *) or precision (.).
  // All conversion characters and length modifiers are alpha characters.
  if (c < 'A') {
    while (c <= '0') {
      auto tag = GetTagForChar(c);
      if (tag.is_flags()) {
        conv->flags = conv->flags | tag.as_flags();
        ABSL_FORMAT_PARSER_INTERNAL_GET_CHAR();
      } else {
        break;
      }
    }

    if (c <= '9') {
      if (c >= '0') {
        int maybe_width = ParseDigits(c, pos, end);
        if (!is_positional && c == '$') {
          if (ABSL_PREDICT_FALSE(*next_arg != 0)) return nullptr;
          // Positional conversion.
          *next_arg = -1;
          return ConsumeConversion<true>(original_pos, end, conv, next_arg);
        }
        conv->flags = conv->flags | Flags::kNonBasic;
        conv->width.set_value(maybe_width);
      } else if (c == '*') {
        conv->flags = conv->flags | Flags::kNonBasic;
        ABSL_FORMAT_PARSER_INTERNAL_GET_CHAR();
        if (is_positional) {
          if (ABSL_PREDICT_FALSE(c < '1' || c > '9')) return nullptr;
          conv->width.set_from_arg(ParseDigits(c, pos, end));
          if (ABSL_PREDICT_FALSE(c != '$')) return nullptr;
          ABSL_FORMAT_PARSER_INTERNAL_GET_CHAR();
        } else {
          conv->width.set_from_arg(++*next_arg);
        }
      }
    }

    if (c == '.') {
      conv->flags = conv->flags | Flags::kNonBasic;
      ABSL_FORMAT_PARSER_INTERNAL_GET_CHAR();
      if ('0' <= c && c <= '9') {
        conv->precision.set_value(ParseDigits(c, pos, end));
      } else if (c == '*') {
        ABSL_FORMAT_PARSER_INTERNAL_GET_CHAR();
        if (is_positional) {
          if (ABSL_PREDICT_FALSE(c < '1' || c > '9')) return nullptr;
          conv->precision.set_from_arg(ParseDigits(c, pos, end));
          if (c != '$') return nullptr;
          ABSL_FORMAT_PARSER_INTERNAL_GET_CHAR();
        } else {
          conv->precision.set_from_arg(++*next_arg);
        }
      } else {
        conv->precision.set_value(0);
      }
    }
  }

  auto tag = GetTagForChar(c);

  if (ABSL_PREDICT_FALSE(c == 'v' && conv->flags != Flags::kBasic)) {
    return nullptr;
  }

  if (ABSL_PREDICT_FALSE(!tag.is_conv())) {
    if (ABSL_PREDICT_FALSE(!tag.is_length())) return nullptr;

    // It is a length modifier.
    LengthMod length_mod = tag.as_length();
    ABSL_FORMAT_PARSER_INTERNAL_GET_CHAR();
    if (c == 'h' && length_mod == LengthMod::h) {
      conv->length_mod = LengthMod::hh;
      ABSL_FORMAT_PARSER_INTERNAL_GET_CHAR();
    } else if (c == 'l' && length_mod == LengthMod::l) {
      conv->length_mod = LengthMod::ll;
      ABSL_FORMAT_PARSER_INTERNAL_GET_CHAR();
    } else {
      conv->length_mod = length_mod;
    }
    tag = GetTagForChar(c);

    if (ABSL_PREDICT_FALSE(c == 'v')) return nullptr;
    if (ABSL_PREDICT_FALSE(!tag.is_conv())) return nullptr;

    // `wchar_t` args are marked non-basic so `Bind()` will copy the length mod.
    if (conv->length_mod == LengthMod::l && c == 'c') {
      conv->flags = conv->flags | Flags::kNonBasic;
    }
  }
#undef ABSL_FORMAT_PARSER_INTERNAL_GET_CHAR

  assert(CheckFastPathSetting(*conv));
  (void)(&CheckFastPathSetting);

  conv->conv = tag.as_conv();
  if (!is_positional) conv->arg_position = ++*next_arg;
  return pos;
}